

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_minimal_logger__on_chk(fct_logger_i *self_,fct_logger_evt_t *e)

{
  fct_minimal_logger_t *self;
  fct_logger_evt_t *e_local;
  fct_logger_i *self__local;
  
  if (e->chk->is_pass == 0) {
    fputs("x",_stdout);
    fct_logger_record_failure(e->chk,(fct_nlist_t *)(self_ + 1));
  }
  else {
    fputs(".",_stdout);
  }
  return;
}

Assistant:

static void
fct_minimal_logger__on_chk(
    fct_logger_i *self_,
    fct_logger_evt_t const *e
)
{
    fct_minimal_logger_t *self = (fct_minimal_logger_t*)self_;
    if ( fctchk__is_pass(e->chk) )
    {
        fputs(".", stdout);
    }
    else
    {
        fputs("x", stdout);
        fct_logger_record_failure(e->chk, &(self->failed_cndtns_list));

    }
}